

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLattice.cpp
# Opt level: O0

void __thiscall OpenMD::shapedLattice::setGridDimension(shapedLattice *this,Vector3d *dimension)

{
  double *pdVar1;
  Vector3<double> *in_RSI;
  Vector3<double> *in_RDI;
  double dVar2;
  
  Vector3<double>::operator=(in_RSI,in_RDI);
  pdVar1 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_ + 1),0);
  dVar2 = ceil((*pdVar1 * 0.5) / in_RDI[5].super_Vector<double,_3U>.data_[0]);
  *(int *)(in_RDI[6].super_Vector<double,_3U>.data_ + 2) = -(int)dVar2;
  pdVar1 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_ + 1),1);
  dVar2 = ceil((*pdVar1 * 0.5) / in_RDI[5].super_Vector<double,_3U>.data_[0]);
  *(int *)((long)in_RDI[6].super_Vector<double,_3U>.data_ + 0x14) = -(int)dVar2;
  pdVar1 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_ + 1),2);
  dVar2 = ceil((*pdVar1 * 0.5) / in_RDI[5].super_Vector<double,_3U>.data_[0]);
  *(int *)in_RDI[7].super_Vector<double,_3U>.data_ = -(int)dVar2;
  pdVar1 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_ + 1),0);
  dVar2 = ceil((*pdVar1 * 0.5) / in_RDI[5].super_Vector<double,_3U>.data_[0]);
  *(int *)((long)in_RDI[7].super_Vector<double,_3U>.data_ + 4) = (int)dVar2;
  pdVar1 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_ + 1),1);
  dVar2 = ceil((*pdVar1 * 0.5) / in_RDI[5].super_Vector<double,_3U>.data_[0]);
  *(int *)(in_RDI[7].super_Vector<double,_3U>.data_ + 1) = (int)dVar2;
  pdVar1 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_ + 1),2);
  dVar2 = ceil((*pdVar1 * 0.5) / in_RDI[5].super_Vector<double,_3U>.data_[0]);
  *(int *)((long)in_RDI[7].super_Vector<double,_3U>.data_ + 0xc) = (int)dVar2;
  *(undefined1 *)(in_RDI[2].super_Vector<double,_3U>.data_ + 1) = 0;
  return;
}

Assistant:

void shapedLattice::setGridDimension(Vector3d dimension) {
    dimension_ = dimension;
    // Find	number of unit cells in each direction
    beginNx_       = -(int)ceil(0.5 * dimension_[0] / latticeConstant_);
    beginNy_       = -(int)ceil(0.5 * dimension_[1] / latticeConstant_);
    beginNz_       = -(int)ceil(0.5 * dimension_[2] / latticeConstant_);
    endNx_         = (int)ceil(0.5 * dimension_[0] / latticeConstant_);
    endNy_         = (int)ceil(0.5 * dimension_[1] / latticeConstant_);
    endNz_         = (int)ceil(0.5 * dimension_[2] / latticeConstant_);
    sitesComputed_ = false;
  }